

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

Reference<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
::EmplaceBack<absl::lts_20250127::cord_internal::CordRep*const&>
          (Storage<absl::lts_20250127::cord_internal::CordRep*,2ul,std::allocator<absl::lts_20250127::cord_internal::CordRep*>>
           *this,CordRep **args)

{
  allocator<absl::lts_20250127::cord_internal::CordRep_*> *__a;
  Pointer<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> last_ptr;
  SizeType<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> n;
  StorageView<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> storage_view;
  CordRep **args_local;
  Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  *this_local;
  
  storage_view.capacity =
       (SizeType<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>)args;
  Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
  ::MakeStorageView((StorageView<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_> *)&n
                    ,(Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                      *)this);
  if (storage_view.data ==
      (Pointer<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>)storage_view.size) {
    this_local = (Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                  *)EmplaceBackSlow<absl::lts_20250127::cord_internal::CordRep*const&>
                              (this,(CordRep **)storage_view.capacity);
  }
  else {
    this_local = (Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                  *)(n + (long)storage_view.data * 8);
    __a = Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
          ::GetAllocator((Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
                          *)this);
    std::allocator_traits<std::allocator<absl::lts_20250127::cord_internal::CordRep*>>::
    construct<absl::lts_20250127::cord_internal::CordRep*,absl::lts_20250127::cord_internal::CordRep*const&>
              (__a,(CordRep **)this_local,(CordRep **)storage_view.capacity);
    Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
    ::AddSize((Storage<absl::lts_20250127::cord_internal::CordRep_*,_2UL,_std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>
               *)this,1);
  }
  return (Reference<std::allocator<absl::lts_20250127::cord_internal::CordRep_*>_>)this_local;
}

Assistant:

auto Storage<T, N, A>::EmplaceBack(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  const SizeType<A> n = storage_view.size;
  if (ABSL_PREDICT_TRUE(n != storage_view.capacity)) {
    // Fast path; new element fits.
    Pointer<A> last_ptr = storage_view.data + n;
    AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                  std::forward<Args>(args)...);
    AddSize(1);
    return *last_ptr;
  }
  // TODO(b/173712035): Annotate with musttail attribute to prevent regression.
  return EmplaceBackSlow(std::forward<Args>(args)...);
}